

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

attribute_keys_map_t * tchecker::system::system_t::known_attributes_abi_cxx11_(void)

{
  int iVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_3a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (known_attributes[abi:cxx11]()::known_attr_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_);
    if (iVar1 != 0) {
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[0]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[1]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[2]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[3]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"initial","");
      __l._M_len = 1;
      __l._M_array = &local_38;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 4,__l,&local_39,
            &local_3a);
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[5]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[6]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl._0_8_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl.
      super__Rb_tree_header._M_header._4_4_ = 0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl.
            super__Rb_tree_header._M_header;
      known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems[7]._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::
                   array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_8UL>
                   ::~array,&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_);
    }
  }
  return &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_;
}

Assistant:

tchecker::system::attribute_keys_map_t const & system_t::known_attributes()
{
  static tchecker::system::attribute_keys_map_t const known_attr = {{
      {},          // tchecker::system::ATTR_CLOCK
      {},          // tchecker::system::ATTR_EDGE
      {},          // tchecker::system::ATTR_EVENT
      {},          // tchecker::system::ATTR_INTVAR
      {"initial"}, // tchecker::system::ATTR_LOCATION
      {},          // tchecker::system::ATTR_PROCESS
      {},          // tchecker::system::ATTR_SYNC
      {}           // tchecker::system::ATTR_SYSTEM
  }};
  return known_attr;
}